

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractRoomAction.cpp
# Opt level: O0

ActionResults * __thiscall AbstractRoomAction::Use(AbstractRoomAction *this)

{
  ItemTable *this_00;
  ActionResults *this_01;
  string local_c8 [52];
  itemType local_94;
  undefined1 local_90 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  string local_30 [8];
  string information;
  AbstractRoomAction *this_local;
  
  std::__cxx11::string::string(local_30);
  this_00 = this->itemList;
  local_94 = Command::getMainItem(this->commands);
  ItemTable::getValue(this_00,&local_94);
  ItemWrapper::getItemName_abi_cxx11_((ItemWrapper *)local_90);
  std::operator+(local_90 + 0x20,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "You contemplate using ");
  std::operator+(local_50,local_90 + 0x20);
  std::__cxx11::string::operator=(local_30,(string *)local_50);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(local_90 + 0x20));
  std::__cxx11::string::~string((string *)local_90);
  this_01 = (ActionResults *)operator_new(0x30);
  std::__cxx11::string::string(local_c8,local_30);
  ActionResults::ActionResults(this_01,CURRENT,(string *)local_c8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_30);
  return this_01;
}

Assistant:

ActionResults * AbstractRoomAction::Use() {
    std::string information;

    information = "You contemplate using " + itemList->getValue(commands->getMainItem())->getItemName() + " but do not see the use. "
                                                                                                                  "Perhaps you should do or use something else.";
    return new ActionResults(CURRENT, information);
}